

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_2::ConsoleAssertionPrinter::print(ConsoleAssertionPrinter *this)

{
  size_t sVar1;
  ConsoleAssertionPrinter *this_local;
  
  printSourceInfo(this);
  sVar1 = Counts::total(&(this->stats->totals).assertions);
  if (sVar1 == 0) {
    std::operator<<((ostream *)this->stream,'\n');
  }
  else {
    printResultType(this);
    printOriginalExpression(this);
    printReconstructedExpression(this);
  }
  printMessage(this);
  return;
}

Assistant:

void print() const {
        printSourceInfo();
        if (stats.totals.assertions.total() > 0) {
            printResultType();
            printOriginalExpression();
            printReconstructedExpression();
        } else {
            stream << '\n';
        }
        printMessage();
    }